

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O0

protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *
protobuf_test_messages_proto2_TestAllTypesProto2_optional_nested_message
          (protobuf_test_messages_proto2_TestAllTypesProto2 *msg)

{
  protobuf_test_messages_proto2_TestAllTypesProto2 *to;
  upb_MiniTableField *f;
  bool bVar1;
  void *from;
  undefined1 local_4c [8];
  upb_MiniTableField field;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *ret;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *default_val;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg_local;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage **local_20;
  upb_MiniTableField *local_18;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *local_10;
  
  ret = (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)0x0;
  local_4c._0_4_ = 0x12;
  local_4c._4_2_ = 0x138;
  local_4c._6_2_ = 0x4f;
  field.number_dont_copy_me__upb_internal_use_only = 0xc20b0000;
  default_val = (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)msg;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init);
  local_10 = default_val;
  local_18 = (upb_MiniTableField *)local_4c;
  local_20 = &ret;
  msg_local = (protobuf_test_messages_proto2_TestAllTypesProto2 *)
              &field.offset_dont_copy_me__upb_internal_use_only;
  bVar1 = upb_MiniTableField_IsExtension(local_18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  bVar1 = upb_MiniTableField_IsInOneof(local_18);
  if (((bVar1) ||
      (bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(local_18,local_20)
      , !bVar1)) &&
     (bVar1 = upb_Message_HasBaseField(&local_10->base_dont_copy_me__upb_internal_use_only,local_18)
     , !bVar1)) {
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(local_18,msg_local,local_20);
    return (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)field._4_8_;
  }
  f = local_18;
  to = msg_local;
  from = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                   (&local_10->base_dont_copy_me__upb_internal_use_only,local_18);
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,to,from);
  return (protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *)field._4_8_;
}

Assistant:

UPB_INLINE const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* protobuf_test_messages_proto2_TestAllTypesProto2_optional_nested_message(const protobuf_test_messages_proto2_TestAllTypesProto2* msg) {
  const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* default_val = NULL;
  const protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* ret;
  const upb_MiniTableField field = {18, UPB_SIZE(44, 312), 79, 0, 11, (int)kUpb_FieldMode_Scalar | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init);
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}